

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O3

int use_full(char *prog)

{
  puts(
      "nifti_tool\n\n   - display, modify or compare nifti structures in datasets\n   - copy a dataset by selecting a list of volumes from the original\n   - copy a dataset, collapsing any dimensions, each to a single index\n   - display a time series for a voxel, or more generally, the data\n       from any collapsed image, in ASCII text"
      );
  puts(
      "\n  This program can be used to display information from nifti datasets,\n  to modify information in nifti datasets, to look for differences\n  between two nifti datasets (like the UNIX \'diff\' command), and to copy\n  a dataset to a new one, either by restricting any dimensions, or by\n  copying a list of volumes (the time dimension) from a dataset.\n"
      );
  puts(
      "  Only one action type is allowed, e.g. one cannot modify a dataset\n  and then take a \'diff\'.\n"
      );
  puts(
      "  one can display - any or all fields in the nifti_1_header structure\n                  - any or all fields in the nifti_image structure\n                  - any or all fields in the nifti_analyze75 structure\n                  - the extensions in the nifti_image structure\n                  - the time series from a 4-D dataset, given i,j,k\n                  - the data from any collapsed image, given dims. list\n"
      );
  puts(
      "  one can check   - perform internal check on the nifti_1_header struct\n                    (by nifti_hdr_looks_good())\n                  - perform internal check on the nifti_image struct\n                    (by nifti_nim_is_valid())\n"
      );
  puts(
      "  one can modify  - any or all fields in the nifti_1_header structure\n                  - any or all fields in the nifti_image structure\n                  - swap all fields in NIFTI or ANALYZE header structure\n          add/rm  - any or all extensions in the nifti_image structure\n          remove  - all extensions and descriptions from the datasets\n"
      );
  puts(
      "  one can compare - any or all field pairs of nifti_1_header structures\n                  - any or all field pairs of nifti_image structures\n\n  one can copy    - an arbitrary list of dataset volumes (time points)\n                  - a dataset, collapsing across arbitrary dimensions\n                    (restricting those dimensions to the given indices)\n\n  one can create  - a new dataset out of nothing\n"
      );
  puts(
      "  Note: to learn about which fields exist in either of the structures,\n        or to learn a field\'s type, size of each element, or the number\n        of elements in the field, use either the \'-help_hdr\' option, or\n        the \'-help_nim\' option.  No further options are required.\n  ------------------------------"
      );
  puts(
      "\n  usage styles:\n\n    nifti_tool -help                 : show this help\n    nifti_tool -help_hdr             : show nifti_1_header field info\n    nifti_tool -help_nim             : show nifti_image field info\n    nifti_tool -help_ana             : show nifti_analyze75 field info\n    nifti_tool -help_datatypes       : show datatype table\n"
      );
  puts(
      "    nifti_tool -ver                  : show the current version\n    nifti_tool -hist                 : show the modification history\n    nifti_tool -nifti_ver            : show the nifti library version\n    nifti_tool -nifti_hist           : show the nifti library history\n    nifti_tool -with_zlib            : was library compiled with zlib\n\n"
      );
  puts("    nifti_tool -check_hdr -infiles f1 ...\n    nifti_tool -check_nim -infiles f1 ...\n");
  puts(
      "    nifti_tool -copy_brick_list -infiles f1\'[indices...]\'\n    nifti_tool -copy_collapsed_image I J K T U V W -infiles f1\n    nifti_tool -copy_im -infiles f1\n"
      );
  puts("    nifti_tool -make_im -prefix new_im.nii\n");
  puts(
      "    nifti_tool -disp_hdr [-field FIELDNAME] [...] -infiles f1 ...\n    nifti_tool -disp_nim [-field FIELDNAME] [...] -infiles f1 ...\n    nifti_tool -disp_ana [-field FIELDNAME] [...] -infiles f1 ...\n    nifti_tool -disp_exts -infiles f1 ...\n    nifti_tool -disp_ts I J K [-dci_lines] -infiles f1 ...\n    nifti_tool -disp_ci I J K T U V W [-dci_lines] -infiles f1 ...\n"
      );
  puts(
      "    nifti_tool -mod_hdr  [-mod_field FIELDNAME NEW_VAL] [...] -infiles f1\n    nifti_tool -mod_nim  [-mod_field FIELDNAME NEW_VAL] [...] -infiles f1\n\n    nifti_tool -swap_as_nifti   -overwrite -infiles f1\n    nifti_tool -swap_as_analyze -overwrite -infiles f1\n    nifti_tool -swap_as_old     -overwrite -infiles f1\n"
      );
  puts(
      "    nifti_tool -add_afni_ext    \'extension in quotes\' [...] -infiles f1\n    nifti_tool -add_comment_ext \'extension in quotes\' [...] -infiles f1\n    nifti_tool -add_comment_ext \'file:FILENAME\' [...] -infiles f1\n    nifti_tool -rm_ext INDEX [...] -infiles f1 ...\n    nifti_tool -strip_extras -infiles f1 ...\n"
      );
  puts(
      "    nifti_tool -diff_hdr [-field FIELDNAME] [...] -infiles f1 f2\n    nifti_tool -diff_nim [-field FIELDNAME] [...] -infiles f1 f2\n\n  ------------------------------"
      );
  puts(
      "\n  selected examples:\n\n    A. checks header (for problems):\n\n      1. nifti_tool -check_hdr -infiles dset0.nii dset1.nii\n      2. nifti_tool -check_hdr -infiles *.nii *.hdr\n      3. nifti_tool -check_hdr -quiet -infiles *.nii *.hdr\n"
      );
  puts(
      "    B. show header differences:\n\n      1. nifti_tool -diff_hdr -field dim -field intent_code  \\\n                    -infiles dset0.nii dset1.nii \n      2. nifti_tool -diff_hdr -new_dims 3 10 20 30 0 0 0 0   \\\n                    -infiles my_dset.nii MAKE_IM \n\n    C. display structures or fields:\n"
      );
  puts(
      "      1. nifti_tool -disp_hdr -infiles dset0.nii dset1.nii dset2.nii\n      2. nifti_tool -disp_hdr -field dim -field descrip -infiles dset.nii\n      3. nifti_tool -disp_exts -infiles dset0.nii dset1.nii dset2.nii\n      4. nifti_tool -disp_ts 23 0 172 -infiles dset1_time.nii\n      5. nifti_tool -disp_ci 23 0 172 -1 0 0 0 -infiles dset1_time.nii\n"
      );
  puts(
      "      6. nifti_tool -disp_ana -infiles analyze.hdr\n      7. nifti_tool -disp_nim -infiles nifti.nii\n"
      );
  puts(
      "    D. create a new dataset from nothing:\n\n      1. nifti_tool -make_im -prefix new_im.nii \n      2. nifti_tool -make_im -prefix float_im.nii \\\n                    -new_dims 3 10 20 30 0 0 0 0  -new_datatype 16"
      );
  puts(
      "      3. nifti_tool -mod_hdr -mod_field descrip \'dataset with mods\'  \\\n                    -new_dims 3 10 20 30 0 0 0 0                     \\\n                    -prefix new_desc.nii -infiles MAKE_IM\n"
      );
  puts(
      "    E. copy dataset, brick list or collapsed image:\n\n      1. nifti_tool -copy_im -prefix new.nii -infiles dset0.nii\n      2. nifti_tool -cbl -prefix new_07.nii -infiles dset0.nii\'[0,7]\'\n      3. nifti_tool -cbl -prefix new_partial.nii \\\n                    -infiles dset0.nii\'[3..$(2)]\'\n\n      4. nifti_tool -cci 5 4 17 -1 -1 -1 -1 -prefix new_5_4_17.nii\n      5. nifti_tool -cci 5 0 17 -1 -1 2 -1  -keep_hist \\\n                    -prefix new_5_0_17_2.nii\n"
      );
  puts(
      "    F. modify the header (modify fields or swap entire header):\n\n      1. nifti_tool -mod_hdr -prefix dnew -infiles dset0.nii  \\\n                    -mod_field dim \'4 64 64 20 30 1 1 1 1\'\n      2. nifti_tool -mod_hdr -prefix dnew -infiles dset0.nii  \\\n                    -mod_field descrip \'beer, brats and cheese, mmmmm...\'"
      );
  puts(
      "      3. cp old_dset.hdr nifti_swap.hdr \n         nifti_tool -swap_as_nifti -overwrite -infiles nifti_swap.hdr\n      4. cp old_dset.hdr analyze_swap.hdr \n         nifti_tool -swap_as_analyze -overwrite -infiles analyze_swap.hdr\n      5. nifti_tool -swap_as_old -prefix old_swap.hdr -infiles old_dset.hdr\n         nifti_tool -diff_hdr -infiles nifti_swap.hdr old_swap.hdr\n"
      );
  puts(
      "    G. strip, add or remove extensions:\n       (in example #3, the extension is copied from a text file)\n\n\n      1. nifti_tool -strip -overwrite -infiles *.nii\n      2. nifti_tool -add_comment \'converted from MY_AFNI_DSET+orig\' \\\n                    -prefix dnew -infiles dset0.nii"
      );
  puts(
      "      3. nifti_tool -add_comment \'file:my.extension.txt\' \\\n                    -prefix dnew -infiles dset0.nii\n      4. nifti_tool -rm_ext ALL -prefix dset1 -infiles dset0.nii\n      5. nifti_tool -rm_ext 2 -rm_ext 3 -rm_ext 5 -overwrite \\\n                    -infiles dset0.nii\n\n  ------------------------------"
      );
  puts("\n  options for check actions:\n");
  puts(
      "    -check_hdr         : check for a valid nifti_1_header struct\n\n       This action is used to check the nifti_1_header structure for\n       problems.  The nifti_hdr_looks_good() function is used for the\n       test, and currently checks:\n       \n         dim[], sizeof_hdr, magic, datatype\n       \n       More tests can be requested of the author.\n"
      );
  puts(
      "       e.g. perform checks on the headers of some datasets\n       nifti_tool -check_hdr -infiles dset0.nii dset1.nii\n       nifti_tool -check_hdr -infiles *.nii *.hdr\n       \n       e.g. add the -quiet option, so that only errros are reported\n       nifti_tool -check_hdr -quiet -infiles *.nii *.hdr\n"
      );
  puts(
      "    -check_nim         : check for a valid nifti_image struct\n\n       This action is used to check the nifti_image structure for\n       problems.  This is tested via both nifti_convert_nhdr2nim()\n       and nifti_nim_is_valid(), though other functions are called\n       below them, of course.  Current checks are:\n"
      );
  puts(
      "         dim[], sizeof_hdr, datatype, fname, iname, nifti_type\n       \n       Note that creation of a nifti_image structure depends on good\n       header fields.  So errors are terminal, meaning this check would\n       probably report at most one error, even if more exist.  The\n       -check_hdr action is more complete.\n"
      );
  puts("       More tests can be requested of the author.\n");
  puts(
      "             e.g. nifti_tool -check_nim -infiles dset0.nii dset1.nii\n             e.g. nifti_tool -check_nim -infiles *.nii *.hdr\n"
      );
  puts("  ------------------------------");
  puts("\n  options for create action:\n");
  puts(
      "    -make_im           : create a new dataset from nothing\n\n       With this the user can create a new dataset of a basic style,\n       which can then be modified with other options.  This will create\n       zero-filled data of the appropriate size.\n       "
      );
  puts(
      "       The default is a 1x1x1 image of shorts.  These settings can be\n       modified with the -new_dim option, to set the 8 dimension values,\n       and the -new_datatype, to provide the integral type for the data.\n"
      );
  puts(
      "       See -new_dim, -new_datatype and -infiles for more information.\n       \n       Note that any -infiles dataset of the name MAKE_IM will also be\n       created on the fly.\n"
      );
  puts(
      "    -new_dim D0 .. D7  : specify the dim array for the a new dataset.\n\n         e.g. -new_dim 4 64 64 27 120 0 0 0\n\n       This dimension list will apply to any dataset created via\n       MAKE_IM or -make_im.  All 8 values are required.  Recall that\n       D0 is the number of dimensions, and D1 through D7 are the sizes.\n       "
      );
  puts(
      "    -new_datatype TYPE : specify the dim array for the a new dataset.\n\n         e.g. -new_datatype 16\n         default: -new_datatype 4   (short)\n\n       This dimension list will apply to any dataset created via\n       MAKE_IM or -make_im.  TYPE should be one of the NIFTI_TYPE_*\n       numbers, from nifti1.h.\n       "
      );
  puts("  ------------------------------");
  puts(
      "\n  options for copy actions:\n\n    -copy_brick_list   : copy a list of volumes to a new dataset\n    -cbl               : (a shorter, alternative form)\n    -copy_im           : (a shorter, alternative form)\n"
      );
  puts(
      "       This action allows the user to copy a list of volumes (over time)\n       from one dataset to another.  The listed volumes can be in any\n       order and contain repeats, but are of course restricted to\n       the set of values {1, 2, ..., nt-1}, from dimension 4.\n"
      );
  puts(
      "       This option is a flag.  The index list is specified with the input\n       dataset, contained in square brackets.  Note that square brackets\n       are special to most UNIX shells, so they should be contained\n       within single quotes.  Syntax of an index list:\n\n       notes:\n"
      );
  puts(
      "         - indices start at zero\n         - indices end at nt-1, which has the special symbol \'$\'\n         - single indices should be separated with commas, \',\'\n             e.g. -infiles dset0.nii\'[0,3,8,5,2,2,2]\'\n         - ranges may be specified using \'..\' or \'-\' "
      );
  puts(
      "             e.g. -infiles dset0.nii\'[2..95]\'\n             e.g. -infiles dset0.nii\'[2..$]\'\n         - ranges may have step values, specified in ()\n           example: 2 through 95 with a step of 3, i.e. {2,5,8,11,...,95}\n             e.g. -infiles dset0.nii\'[2..95(3)]\'\n"
      );
  puts(
      "       This functionality applies only to 3 or 4-dimensional datasets.\n\n       e.g. to copy a dataset:\n       nifti_tool -copy_im -prefix new.nii -infiles dset0.nii\n"
      );
  puts(
      "       e.g. to copy sub-bricks 0 and 7:\n       nifti_tool -cbl -prefix new_07.nii -infiles dset0.nii\'[0,7]\'\n\n       e.g. to copy an entire dataset:\n       nifti_tool -cbl -prefix new_all.nii -infiles dset0.nii\'[0..$]\'\n"
      );
  puts(
      "       e.g. to copy every other time point, skipping the first three:\n       nifti_tool -cbl -prefix new_partial.nii \\\n                  -infiles dset0.nii\'[3..$(2)]\'\n\n\n    -copy_collapsed_image ... : copy a list of volumes to a new dataset\n    -cci I J K T U V W        : (a shorter, alternative form)\n"
      );
  puts(
      "       This action allows the user to copy a collapsed dataset, where\n       some dimensions are collapsed to a given index.  For instance, the\n       X dimension could be collapsed to i=42, and the time dimensions\n       could be collapsed to t=17.  To collapse a dimension, set Di to\n       the desired index, where i is in {0..ni-1}.  Any dimension that\n       should not be collapsed must be listed as -1.\n"
      );
  puts(
      "       Any number (of valid) dimensions can be collapsed, even down to a\n       a single value, by specifying enough valid indices.  The resulting\n       dataset will then have a reduced number of non-trivial dimensions.\n\n       Assume dset0.nii has nim->dim[8] = { 4, 64, 64, 21, 80, 1, 1, 1 }.\n       Note that this is a 4-dimensional dataset.\n"
      );
  puts(
      "         e.g. copy the time series for voxel i,j,k = 5,4,17\n         nifti_tool -cci 5 4 17 -1 -1 -1 -1 -prefix new_5_4_17.nii\n\n         e.g. read the single volume at time point 26\n         nifti_tool -cci -1 -1 -1 26 -1 -1 -1 -prefix new_t26.nii\n"
      );
  puts(
      "       Assume dset1.nii has nim->dim[8] = { 6, 64, 64, 21, 80, 4, 3, 1 }.\n       Note that this is a 6-dimensional dataset.\n\n         e.g. copy all time series for voxel i,j,k = 5,0,17, with v=2\n              (and add the command to the history)\n         nifti_tool -cci 5 0 17 -1 -1 2 -1  -keep_hist \\\n                    -prefix new_5_0_17_2.nii\n"
      );
  puts(
      "         e.g. copy all data where i=3, j=19 and v=2\n              (I do not claim to know a good reason to do this)\n         nifti_tool -cci 3 19 -1 -1 -1 2 -1 -prefix new_mess.nii\n\n       See \'-disp_ci\' for more information (which displays/prints the\n       data, instead of copying it to a new dataset).\n\n  ------------------------------"
      );
  puts(
      "\n  options for display actions:\n\n    -disp_hdr          : display nifti_1_header fields for datasets\n\n       This flag means the user wishes to see some of the nifti_1_header\n       fields in one or more nifti datasets. The user may want to specify\n       multiple \'-field\' options along with this.  This option requires\n       one or more files input, via \'-infiles\'.\n"
      );
  puts(
      "       If no \'-field\' option is present, all fields will be displayed.\n\n       e.g. to display the contents of all fields:\n       nifti_tool -disp_hdr -infiles dset0.nii\n       nifti_tool -disp_hdr -infiles dset0.nii dset1.nii dset2.nii\n\n       e.g. to display the contents of select fields:\n       nifti_tool -disp_hdr -field dim -infiles dset0.nii\n       nifti_tool -disp_hdr -field dim -field descrip -infiles dset0.nii\n"
      );
  puts(
      "    -disp_nim          : display nifti_image fields for datasets\n\n       This flag option works the same way as the \'-disp_hdr\' option,\n       except that the fields in question are from the nifti_image\n       structure.\n"
      );
  puts(
      "    -disp_ana          : display nifti_analyze75 fields for datasets\n\n       This flag option works the same way as the \'-disp_hdr\' option,\n       except that the fields in question are from the nifti_analyze75\n       structure.\n"
      );
  puts(
      "    -disp_exts         : display all AFNI-type extensions\n\n       This flag option is used to display all nifti_1_extension data,\n       for only those extensions of type AFNI (code = 4).  The only\n       other option used will be \'-infiles\'.\n"
      );
  puts(
      "       e.g. to display the extensions in datasets:\n       nifti_tool -disp_exts -infiles dset0.nii\n       nifti_tool -disp_exts -infiles dset0.nii dset1.nii dset2.nii\n"
      );
  puts(
      "    -disp_ts I J K    : display ASCII time series at i,j,k = I,J,K\n\n       This option is used to display the time series data for the voxel\n       at i,j,k indices I,J,K.  The data is displayed in text, either all\n       on one line (the default), or as one number per line (via the\n       \'-dci_lines\' option).\n"
      );
  puts(
      "       Notes:\n\n         o This function applies only to 4-dimensional datasets.\n         o The \'-quiet\' option can be used to suppress the text header,\n           leaving only the data.\n         o This option is short for using \'-disp_ci\' (display collapsed\n           image), restricted to 4-dimensional datasets.  i.e. :\n               -disp_ci I J K -1 -1 -1 -1\n"
      );
  puts(
      "       e.g. to display the time series at voxel 23, 0, 172:\n       nifti_tool -disp_ts 23 0 172            -infiles dset1_time.nii\n       nifti_tool -disp_ts 23 0 172 -dci_lines -infiles dset1_time.nii\n       nifti_tool -disp_ts 23 0 172 -quiet     -infiles dset1_time.nii\n"
      );
  puts(
      "    -disp_collapsed_image  : display ASCII values for collapsed dataset\n    -disp_ci I J K T U V W : (a shorter, alternative form)\n\n       This option is used to display all of the data from a collapsed\n       image, given the dimension list.  The data is displayed in text,\n       either all on one line (the default), or as one number per line\n       (by using the \'-dci_lines\' flag).\n"
      );
  puts(
      "       The \'-quiet\' option can be used to suppress the text header.\n\n       e.g. to display the time series at voxel 23, 0, 172:\n       nifti_tool -disp_ci 23 0 172 -1 0 0 0 -infiles dset1_time.nii\n\n       e.g. to display z-slice 14, at time t=68:\n       nifti_tool -disp_ci -1 -1 14 68 0 0 0 -infiles dset1_time.nii\n\n       See \'-ccd\' for more information, which copies such data to a new\n       dataset, instead of printing it to the terminal window.\n\n  ------------------------------"
      );
  puts(
      "\n  options for modification actions:\n\n    -mod_hdr           : modify nifti_1_header fields for datasets\n\n       This action is used to modify some of the nifti_1_header fields in\n       one or more datasets.  The user must specify a list of fields to\n       modify via one or more \'-mod_field\' options, which include field\n       names, along with the new (set of) values.\n"
      );
  puts(
      "       The user can modify a dataset in place, or use \'-prefix\' to\n       produce a new dataset, to which the changes have been applied.\n       It is recommended to normally use the \'-prefix\' option, so as not\n       to ruin a dataset.\n"
      );
  puts(
      "       Note that some fields have a length greater than 1, meaning that\n       the field is an array of numbers, or a string of characters.  In\n       order to modify an array of numbers, the user must provide the\n       correct number of values, and contain those values in quotes, so\n       that they are seen as a single option.\n"
      );
  puts(
      "       To modify a string field, put the string in quotes.\n\n       The \'-mod_field\' option takes a field_name and a list of values.\n\n       e.g. to modify the contents of various fields:\n"
      );
  puts(
      "       nifti_tool -mod_hdr -prefix dnew -infiles dset0.nii  \\\n                  -mod_field qoffset_x -17.325\n       nifti_tool -mod_hdr -prefix dnew -infiles dset0.nii  \\\n                  -mod_field dim \'4 64 64 20 30 1 1 1 1\'\n       nifti_tool -mod_hdr -prefix dnew -infiles dset0.nii  \\\n                  -mod_field descrip \'beer, brats and cheese, mmmmm...\'\n"
      );
  puts(
      "       e.g. to modify the contents of multiple fields:\n       nifti_tool -mod_hdr -prefix dnew -infiles dset0.nii  \\\n                  -mod_field qoffset_x -17.325 -mod_field slice_start 1\n\n       e.g. to modify the contents of multiple files (must overwrite):\n       nifti_tool -mod_hdr -overwrite -mod_field qoffset_x -17.325   \\\n                  -infiles dset0.nii dset1.nii\n"
      );
  puts(
      "    -mod_nim          : modify nifti_image fields for datasets\n\n       This action option is used the same way that \'-mod_hdr\' is used,\n       except that the fields in question are from the nifti_image\n       structure.\n"
      );
  puts(
      "    -strip_extras     : remove extensions and descriptions from datasets\n\n       This action is used to attempt to \'clean\' a dataset of general\n       text, in order to make it more anonymous.  Extensions and the\n       nifti_image descrip field are cleared by this action.\n"
      );
  puts(
      "       e.g. to strip all *.nii datasets in this directory:\n       nifti_tool -strip -overwrite -infiles *.nii\n"
      );
  puts(
      "    -swap_as_nifti    : swap the header according to nifti_1_header\n\n       Perhaps a NIfTI header is mal-formed, and the user explicitly\n       wants to swap it before performing other operations.  This action\n       will swap the field bytes under the assumption that the header is\n       in the NIfTI format.\n"
      );
  puts(
      "       ** The recommended course of action is to make a copy of the\n          dataset and overwrite the header via -overwrite.  If the header\n          needs such an operation, it is likely that the data would not\n          otherwise be read in correctly.\n"
      );
  puts(
      "    -swap_as_analyze  : swap the header according to nifti_analyze75\n\n       Perhaps an ANALYZE header is mal-formed, and the user explicitly\n       wants to swap it before performing other operations.  This action\n       will swap the field bytes under the assumption that the header is\n       in the ANALYZE 7.5 format.\n"
      );
  puts(
      "       ** The recommended course of action is to make a copy of the\n          dataset and overwrite the header via -overwrite.  If the header\n          needs such an operation, it is likely that the data would not\n          otherwise be read in correctly.\n"
      );
  puts(
      "    -swap_as_old      : swap the header using the old method\n\n       As of library version 1.35 (3 Aug, 2008), nifticlib now swaps all\n       fields of a NIfTI dataset (including UNUSED ones), and it swaps\n       ANALYZE datasets according to the nifti_analyze75 structure.\n       This is a significant different in the case of ANALYZE datasets.\n"
      );
  puts(
      "       The -swap_as_old option was added to compare the results of the\n       swapping methods, or to undo one swapping method and replace it\n       with another (such as to undo the old method and apply the new).\n"
      );
  puts("  ------------------------------");
  puts(
      "\n  options for adding/removing extensions:\n\n    -add_afni_ext EXT : add an AFNI extension to the dataset\n\n       This option is used to add AFNI-type extensions to one or more\n       datasets.  This option may be used more than once to add more than\n       one extension.\n\n       If EXT is of the form \'file:FILENAME\', then the extension will\n       be read from the file, FILENAME.\n"
      );
  puts(
      "       The \'-prefix\' option is recommended, to create a new dataset.\n       In such a case, only a single file may be taken as input.  Using\n       \'-overwrite\' allows the user to overwrite the current file, or\n       to add the extension(s) to multiple files, overwriting them.\n"
      );
  puts(
      "       e.g. to add a generic AFNI extension:\n       nifti_tool -add_afni_ext \'wow, my first extension\' -prefix dnew \\\n                  -infiles dset0.nii\n\n       e.g. to add multiple AFNI extensions:\n       nifti_tool -add_afni_ext \'wow, my first extension :)\'      \\\n                  -add_afni_ext \'look, my second...\'              \\\n                  -prefix dnew -infiles dset0.nii\n"
      );
  puts(
      "       e.g. to add an extension, and overwrite the dataset:\n       nifti_tool -add_afni_ext \'some AFNI extension\' -overwrite \\\n                  -infiles dset0.nii dset1.nii \n"
      );
  puts(
      "    -add_comment_ext EXT : add a COMMENT extension to the dataset\n\n       This option is used to add COMMENT-type extensions to one or more\n       datasets.  This option may be used more than once to add more than\n       one extension.  This option may also be used with \'-add_afni_ext\'.\n\n       If EXT is of the form \'file:FILENAME\', then the extension will\n       be read from the file, FILENAME.\n"
      );
  puts(
      "       The \'-prefix\' option is recommended, to create a new dataset.\n       In such a case, only a single file may be taken as input.  Using\n       \'-overwrite\' allows the user to overwrite the current file, or\n       to add the extension(s) to multiple files, overwriting them.\n"
      );
  puts(
      "       e.g. to add a comment about the dataset:\n       nifti_tool -add_comment \'converted from MY_AFNI_DSET+orig\' \\\n                  -prefix dnew                                    \\\n                  -infiles dset0.nii\n"
      );
  puts(
      "       e.g. to add multiple extensions:\n       nifti_tool -add_comment  \'add a comment extension\'         \\\n                  -add_afni_ext \'and an AFNI XML style extension\' \\\n                  -add_comment  \'dataset copied from dset0.nii\'   \\\n                  -prefix dnew -infiles dset0.nii\n"
      );
  puts(
      "    -rm_ext INDEX     : remove the extension given by INDEX\n\n       This option is used to remove any single extension from the\n       dataset.  Multiple extensions require multiple options.\n\n       notes  - extension indices begin with 0 (zero)\n              - to view the current extensions, see \'-disp_exts\'\n              - all extensions can be removed using ALL or -1 for INDEX\n"
      );
  puts(
      "       e.g. to remove the extension #0:\n       nifti_tool -rm_ext 0 -overwrite -infiles dset0.nii\n\n       e.g. to remove ALL extensions:\n       nifti_tool -rm_ext ALL -prefix dset1 -infiles dset0.nii\n       nifti_tool -rm_ext -1  -prefix dset1 -infiles dset0.nii\n"
      );
  puts(
      "       e.g. to remove the extensions #2, #3 and #5:\n       nifti_tool -rm_ext 2 -rm_ext 3 -rm_ext 5 -overwrite \\\n                  -infiles dset0.nii\n\n  ------------------------------"
      );
  puts(
      "\n  options for showing differences:\n\n    -diff_hdr         : display header field diffs between two datasets\n\n       This option is used to find differences between two datasets.\n       If any fields are different, the contents of those fields is\n       displayed (unless the \'-quiet\' option is used).\n"
      );
  puts(
      "       A list of fields can be specified by using multiple \'-field\'\n       options.  If no \'-field\' option is given, all fields will be\n       checked.\n\n       Exactly two dataset names must be provided via \'-infiles\'.\n\n       e.g. to display all nifti_1_header field differences:\n       nifti_tool -diff_hdr -infiles dset0.nii dset1.nii\n"
      );
  puts(
      "       e.g. to display selected nifti_1_header field differences:\n       nifti_tool -diff_hdr -field dim -field intent_code  \\\n                  -infiles dset0.nii dset1.nii \n\n    -diff_nim         : display nifti_image field diffs between datasets\n\n       This option works the same as \'-diff_hdr\', except that the fields\n       in question are from the nifti_image structure.\n\n  ------------------------------"
      );
  puts(
      "\n  miscellaneous options:\n\n    -debug LEVEL      : set the debugging level\n\n       Level 0 will attempt to operate with no screen output, but errors.\n       Level 1 is the default.\n       Levels 2 and 3 give progressively more information.\n\n       e.g. -debug 2\n"
      );
  puts(
      "    -field FIELDNAME  : provide a field to work with\n\n       This option is used to provide a field to display, modify or\n       compare.  This option can be used along with one of the action\n       options presented above.\n\n       See \'-disp_hdr\', above, for complete examples.\n\n       e.g. nifti_tool -field descrip\n       e.g. nifti_tool -field descrip -field dim\n"
      );
  puts(
      "    -infiles file0... : provide a list of files to work with\n\n       This parameter is required for any of the actions, in order to\n       provide a list of files to process.  If input filenames do not\n       have an extension, the directory we be searched for any\n       appropriate files (such as .nii or .hdr).\n"
      );
  puts(
      "       Note: if the filename has the form MAKE_IM, then a new dataset\n       will be created, without the need for file input.\n"
      );
  puts(
      "       See \'-mod_hdr\', above, for complete examples.\n\n       e.g. nifti_tool -infiles file0.nii\n       e.g. nifti_tool -infiles file1.nii file2 file3.hdr\n"
      );
  puts(
      "    -mod_field NAME \'VALUE_LIST\' : provide new values for a field\n\n       This parameter is required for any the modification actions.\n       If the user wants to modify any fields of a dataset, this is\n       where the fields and values are specified.\n"
      );
  puts(
      "       NAME is a field name (in either the nifti_1_header structure or\n       the nifti_image structure).  If the action option is \'-mod_hdr\',\n       then NAME must be the name of a nifti_1_header field.  If the\n       action is \'-mod_nim\', NAME must be from a nifti_image structure.\n"
      );
  puts(
      "       VALUE_LIST must be one or more values, as many as are required\n       for the field, contained in quotes if more than one is provided.\n\n       Use \'nifti_tool -help_hdr\' to get a list of nifti_1_header fields\n       Use \'nifti_tool -help_nim\' to get a list of nifti_image fields\n\n       See \'-mod_hdr\', above, for complete examples.\n"
      );
  puts(
      "       e.g. modifying nifti_1_header fields:\n            -mod_field descrip \'toga, toga, toga\'\n            -mod_field qoffset_x 19.4 -mod_field qoffset_z -11\n            -mod_field pixdim \'1 0.9375 0.9375 1.2 1 1 1 1\'\n"
      );
  puts(
      "    -keep_hist         : add the command as COMMENT (to the \'history\')\n\n        When this option is used, the current command will be added\n        as a NIFTI_ECODE_COMMENT type extension.  This provides the\n        ability to keep a history of commands affecting a dataset.\n\n       e.g. -keep_hist\n"
      );
  puts(
      "    -overwrite        : any modifications will be made to input files\n\n       This option is used so that all field modifications, including\n       extension additions or deletions, will be made to the files that\n       are input.\n"
      );
  puts(
      "       In general, the user is recommended to use the \'-prefix\' option\n       to create new files.  But if overwriting the contents of the\n       input files is preferred, this is how to do it.\n\n       See \'-mod_hdr\' or \'-add_afni_ext\', above, for complete examples.\n\n       e.g. -overwrite\n"
      );
  puts(
      "    -prefix           : specify an output file to write change into\n\n       This option is used to specify an output file to write, after\n       modifications have been made.  If modifications are being made,\n       then either \'-prefix\' or \'-overwrite\' is required.\n\n       If no extension is given, the output extension will be \'.nii\'.\n"
      );
  puts(
      "       e.g. -prefix new_dset\n       e.g. -prefix new_dset.nii\n       e.g. -prefix new_dset.hdr\n\n    -quiet            : report only errors or requested information\n\n       This option is equivalent to \'-debug 0\'.\n\n  ------------------------------"
      );
  puts(
      "\n  basic help options:\n\n    -help             : show this help\n\n       e.g.  nifti_tool -help\n\n    -help_hdr         : show nifti_1_header field info\n\n       e.g.  nifti_tool -help_hdr\n\n    -help_nim         : show nifti_image field info\n\n       e.g.  nifti_tool -help_nim\n\n    -help_ana         : show nifti_analyze75 field info\n\n       e.g.  nifti_tool -help_ana"
      );
  puts(
      "\n    -help_datatypes [TYPE] : display datatype table\n\n       e.g.  nifti_tool -help_datatypes\n       e.g.  nifti_tool -help_datatypes N\n\n       This displays the contents of the nifti_type_list table.\n       An additional \'D\' or \'N\' parameter will restrict the type\n       name to \'DT_\' or \'NIFTI_TYPE_\' names, \'T\' will test."
      );
  puts(
      "\n    -ver              : show the program version number\n\n       e.g.  nifti_tool -ver\n\n    -hist             : show the program modification history\n\n       e.g.  nifti_tool -hist\n"
      );
  printf("    -nifti_ver        : show the nifti library version number\n\n       e.g.  nifti_tool -nifti_ver\n\n    -nifti_hist       : show the nifti library modification history\n\n       e.g.  nifti_tool -nifti_hist\n\n    -with_zlib        : print whether library was compiled with zlib\n\n       e.g.  nifti_tool -with_zlib\n\n  ------------------------------\n\n  R. Reynolds\n  compiled: %s\n  %s\n\n"
         ,"May  2 2025",g_version);
  return 1;
}

Assistant:

int use_full(char * prog)
{
   printf(
   "nifti_tool\n"
   "\n"
   "   - display, modify or compare nifti structures in datasets\n"
   "   - copy a dataset by selecting a list of volumes from the original\n"
   "   - copy a dataset, collapsing any dimensions, each to a single index\n"
   "   - display a time series for a voxel, or more generally, the data\n"
   "       from any collapsed image, in ASCII text\n");
   printf(
   "\n"
   "  This program can be used to display information from nifti datasets,\n"
   "  to modify information in nifti datasets, to look for differences\n"
   "  between two nifti datasets (like the UNIX 'diff' command), and to copy\n"
   "  a dataset to a new one, either by restricting any dimensions, or by\n"
   "  copying a list of volumes (the time dimension) from a dataset.\n"
   "\n");
   printf(
   "  Only one action type is allowed, e.g. one cannot modify a dataset\n"
   "  and then take a 'diff'.\n"
   "\n");
   printf(
   "  one can display - any or all fields in the nifti_1_header structure\n"
   "                  - any or all fields in the nifti_image structure\n"
   "                  - any or all fields in the nifti_analyze75 structure\n"
   "                  - the extensions in the nifti_image structure\n"
   "                  - the time series from a 4-D dataset, given i,j,k\n"
   "                  - the data from any collapsed image, given dims. list\n"
   "\n");
   printf(
   "  one can check   - perform internal check on the nifti_1_header struct\n"
   "                    (by nifti_hdr_looks_good())\n"
   "                  - perform internal check on the nifti_image struct\n"
   "                    (by nifti_nim_is_valid())\n"
   "\n");
   printf(
   "  one can modify  - any or all fields in the nifti_1_header structure\n"
   "                  - any or all fields in the nifti_image structure\n"
   "                  - swap all fields in NIFTI or ANALYZE header structure\n"
   "          add/rm  - any or all extensions in the nifti_image structure\n"
   "          remove  - all extensions and descriptions from the datasets\n"
   "\n");
   printf(
   "  one can compare - any or all field pairs of nifti_1_header structures\n"
   "                  - any or all field pairs of nifti_image structures\n"
   "\n"
   "  one can copy    - an arbitrary list of dataset volumes (time points)\n"
   "                  - a dataset, collapsing across arbitrary dimensions\n"
   "                    (restricting those dimensions to the given indices)\n"
   "\n"
   "  one can create  - a new dataset out of nothing\n"
   "\n");
   printf(
   "  Note: to learn about which fields exist in either of the structures,\n"
   "        or to learn a field's type, size of each element, or the number\n"
   "        of elements in the field, use either the '-help_hdr' option, or\n"
   "        the '-help_nim' option.  No further options are required.\n"
   "  ------------------------------\n");
   printf(
   "\n"
   "  usage styles:\n"
   "\n"
   "    nifti_tool -help                 : show this help\n"
   "    nifti_tool -help_hdr             : show nifti_1_header field info\n"
   "    nifti_tool -help_nim             : show nifti_image field info\n"
   "    nifti_tool -help_ana             : show nifti_analyze75 field info\n"
   "    nifti_tool -help_datatypes       : show datatype table\n"
   "\n");
   printf(
   "    nifti_tool -ver                  : show the current version\n"
   "    nifti_tool -hist                 : show the modification history\n"
   "    nifti_tool -nifti_ver            : show the nifti library version\n"
   "    nifti_tool -nifti_hist           : show the nifti library history\n"
   "    nifti_tool -with_zlib            : was library compiled with zlib\n"
   "\n"
   "\n");
   printf(
   "    nifti_tool -check_hdr -infiles f1 ...\n"
   "    nifti_tool -check_nim -infiles f1 ...\n"
   "\n");
   printf(
   "    nifti_tool -copy_brick_list -infiles f1'[indices...]'\n"
   "    nifti_tool -copy_collapsed_image I J K T U V W -infiles f1\n"
   "    nifti_tool -copy_im -infiles f1\n"
   "\n");
   printf(
   "    nifti_tool -make_im -prefix new_im.nii\n"
   "\n");
   printf(
   "    nifti_tool -disp_hdr [-field FIELDNAME] [...] -infiles f1 ...\n"
   "    nifti_tool -disp_nim [-field FIELDNAME] [...] -infiles f1 ...\n"
   "    nifti_tool -disp_ana [-field FIELDNAME] [...] -infiles f1 ...\n"
   "    nifti_tool -disp_exts -infiles f1 ...\n"
   "    nifti_tool -disp_ts I J K [-dci_lines] -infiles f1 ...\n"
   "    nifti_tool -disp_ci I J K T U V W [-dci_lines] -infiles f1 ...\n"
   "\n");
   printf(
   "    nifti_tool -mod_hdr  [-mod_field FIELDNAME NEW_VAL] [...] -infiles f1\n"
   "    nifti_tool -mod_nim  [-mod_field FIELDNAME NEW_VAL] [...] -infiles f1\n"
   "\n"
   "    nifti_tool -swap_as_nifti   -overwrite -infiles f1\n"
   "    nifti_tool -swap_as_analyze -overwrite -infiles f1\n"
   "    nifti_tool -swap_as_old     -overwrite -infiles f1\n"
   "\n");
   printf(
   "    nifti_tool -add_afni_ext    'extension in quotes' [...] -infiles f1\n"
   "    nifti_tool -add_comment_ext 'extension in quotes' [...] -infiles f1\n"
   "    nifti_tool -add_comment_ext 'file:FILENAME' [...] -infiles f1\n"
   "    nifti_tool -rm_ext INDEX [...] -infiles f1 ...\n"
   "    nifti_tool -strip_extras -infiles f1 ...\n"
   "\n");
   printf(
   "    nifti_tool -diff_hdr [-field FIELDNAME] [...] -infiles f1 f2\n"
   "    nifti_tool -diff_nim [-field FIELDNAME] [...] -infiles f1 f2\n"
   "\n"
   "  ------------------------------\n");

   printf(
   "\n"
   "  selected examples:\n"
   "\n"
   "    A. checks header (for problems):\n"
   "\n"
   "      1. nifti_tool -check_hdr -infiles dset0.nii dset1.nii\n"
   "      2. nifti_tool -check_hdr -infiles *.nii *.hdr\n"
   "      3. nifti_tool -check_hdr -quiet -infiles *.nii *.hdr\n"
   "\n");
   printf(
   "    B. show header differences:\n"
   "\n"
   "      1. nifti_tool -diff_hdr -field dim -field intent_code  \\\n"
   "                    -infiles dset0.nii dset1.nii \n"
   "      2. nifti_tool -diff_hdr -new_dims 3 10 20 30 0 0 0 0   \\\n"
   "                    -infiles my_dset.nii MAKE_IM \n"
   "\n"
   "    C. display structures or fields:\n"
   "\n");
   printf(
   "      1. nifti_tool -disp_hdr -infiles dset0.nii dset1.nii dset2.nii\n"
   "      2. nifti_tool -disp_hdr -field dim -field descrip -infiles dset.nii\n"
   "      3. nifti_tool -disp_exts -infiles dset0.nii dset1.nii dset2.nii\n"
   "      4. nifti_tool -disp_ts 23 0 172 -infiles dset1_time.nii\n"
   "      5. nifti_tool -disp_ci 23 0 172 -1 0 0 0 -infiles dset1_time.nii\n"
   "\n");
   printf(
   "      6. nifti_tool -disp_ana -infiles analyze.hdr\n"
   "      7. nifti_tool -disp_nim -infiles nifti.nii\n"
   "\n");
   printf(
   "    D. create a new dataset from nothing:\n"
   "\n"
   "      1. nifti_tool -make_im -prefix new_im.nii \n"
   "      2. nifti_tool -make_im -prefix float_im.nii \\\n"
   "                    -new_dims 3 10 20 30 0 0 0 0  -new_datatype 16\n");
   printf(
   "      3. nifti_tool -mod_hdr -mod_field descrip 'dataset with mods'  \\\n"
   "                    -new_dims 3 10 20 30 0 0 0 0                     \\\n"
   "                    -prefix new_desc.nii -infiles MAKE_IM\n"
   "\n");
   printf(
   "    E. copy dataset, brick list or collapsed image:\n"
   "\n"
   "      1. nifti_tool -copy_im -prefix new.nii -infiles dset0.nii\n"
   "      2. nifti_tool -cbl -prefix new_07.nii -infiles dset0.nii'[0,7]'\n"
   "      3. nifti_tool -cbl -prefix new_partial.nii \\\n"
   "                    -infiles dset0.nii'[3..$(2)]'\n"
   "\n"
   "      4. nifti_tool -cci 5 4 17 -1 -1 -1 -1 -prefix new_5_4_17.nii\n"
   "      5. nifti_tool -cci 5 0 17 -1 -1 2 -1  -keep_hist \\\n"
   "                    -prefix new_5_0_17_2.nii\n"
   "\n");
   printf(
   "    F. modify the header (modify fields or swap entire header):\n"
   "\n"
   "      1. nifti_tool -mod_hdr -prefix dnew -infiles dset0.nii  \\\n"
   "                    -mod_field dim '4 64 64 20 30 1 1 1 1'\n"
   "      2. nifti_tool -mod_hdr -prefix dnew -infiles dset0.nii  \\\n"
   "                    -mod_field descrip 'beer, brats and cheese, mmmmm...'\n"
   );
   printf(
 "      3. cp old_dset.hdr nifti_swap.hdr \n"
 "         nifti_tool -swap_as_nifti -overwrite -infiles nifti_swap.hdr\n"
 "      4. cp old_dset.hdr analyze_swap.hdr \n"
 "         nifti_tool -swap_as_analyze -overwrite -infiles analyze_swap.hdr\n"
 "      5. nifti_tool -swap_as_old -prefix old_swap.hdr -infiles old_dset.hdr\n"
 "         nifti_tool -diff_hdr -infiles nifti_swap.hdr old_swap.hdr\n"
   "\n");
   printf(
   "    G. strip, add or remove extensions:\n"
   "       (in example #3, the extension is copied from a text file)\n"
   "\n"
   "\n"
   "      1. nifti_tool -strip -overwrite -infiles *.nii\n"
   "      2. nifti_tool -add_comment 'converted from MY_AFNI_DSET+orig' \\\n"
   "                    -prefix dnew -infiles dset0.nii\n"
   );
   printf(
   "      3. nifti_tool -add_comment 'file:my.extension.txt' \\\n"
   "                    -prefix dnew -infiles dset0.nii\n"
   "      4. nifti_tool -rm_ext ALL -prefix dset1 -infiles dset0.nii\n"
   "      5. nifti_tool -rm_ext 2 -rm_ext 3 -rm_ext 5 -overwrite \\\n"
   "                    -infiles dset0.nii\n"
   "\n"
   "  ------------------------------\n");
   printf(
   "\n"
   "  options for check actions:\n"
   "\n");
   printf(
   "    -check_hdr         : check for a valid nifti_1_header struct\n"
   "\n"
   "       This action is used to check the nifti_1_header structure for\n"
   "       problems.  The nifti_hdr_looks_good() function is used for the\n"
   "       test, and currently checks:\n"
   "       \n"
   "         dim[], sizeof_hdr, magic, datatype\n"
   "       \n"
   "       More tests can be requested of the author.\n"
   "\n");
   printf(
   "       e.g. perform checks on the headers of some datasets\n"
   "       nifti_tool -check_hdr -infiles dset0.nii dset1.nii\n"
   "       nifti_tool -check_hdr -infiles *.nii *.hdr\n"
   "       \n"
   "       e.g. add the -quiet option, so that only errros are reported\n"
   "       nifti_tool -check_hdr -quiet -infiles *.nii *.hdr\n"
   "\n");
   printf(
   "    -check_nim         : check for a valid nifti_image struct\n"
   "\n"
   "       This action is used to check the nifti_image structure for\n"
   "       problems.  This is tested via both nifti_convert_nhdr2nim()\n"
   "       and nifti_nim_is_valid(), though other functions are called\n"
   "       below them, of course.  Current checks are:\n"
   "\n");
   printf(
   "         dim[], sizeof_hdr, datatype, fname, iname, nifti_type\n"
   "       \n"
   "       Note that creation of a nifti_image structure depends on good\n"
   "       header fields.  So errors are terminal, meaning this check would\n"
   "       probably report at most one error, even if more exist.  The\n"
   "       -check_hdr action is more complete.\n"
   "\n");
   printf(
   "       More tests can be requested of the author.\n"
   "\n");
   printf(
   "             e.g. nifti_tool -check_nim -infiles dset0.nii dset1.nii\n"
   "             e.g. nifti_tool -check_nim -infiles *.nii *.hdr\n"
   "\n");
   printf(
   "  ------------------------------\n");

   printf(
   "\n"
   "  options for create action:\n"
   "\n");
   printf(
   "    -make_im           : create a new dataset from nothing\n"
   "\n"
   "       With this the user can create a new dataset of a basic style,\n"
   "       which can then be modified with other options.  This will create\n"
   "       zero-filled data of the appropriate size.\n"
   "       \n");
   printf(
   "       The default is a 1x1x1 image of shorts.  These settings can be\n"
   "       modified with the -new_dim option, to set the 8 dimension values,\n"
   "       and the -new_datatype, to provide the integral type for the data.\n"
   "\n");
   printf(
   "       See -new_dim, -new_datatype and -infiles for more information.\n"
   "       \n"
   "       Note that any -infiles dataset of the name MAKE_IM will also be\n"
   "       created on the fly.\n"
   "\n");
   printf(
   "    -new_dim D0 .. D7  : specify the dim array for the a new dataset.\n"
   "\n"
   "         e.g. -new_dim 4 64 64 27 120 0 0 0\n"
   "\n"
   "       This dimension list will apply to any dataset created via\n"
   "       MAKE_IM or -make_im.  All 8 values are required.  Recall that\n"
   "       D0 is the number of dimensions, and D1 through D7 are the sizes.\n"
   "       \n");
   printf(
   "    -new_datatype TYPE : specify the dim array for the a new dataset.\n"
   "\n"
   "         e.g. -new_datatype 16\n"
   "         default: -new_datatype 4   (short)\n"
   "\n"
   "       This dimension list will apply to any dataset created via\n"
   "       MAKE_IM or -make_im.  TYPE should be one of the NIFTI_TYPE_*\n"
   "       numbers, from nifti1.h.\n"
   "       \n");
   printf(
   "  ------------------------------\n");
   printf(
   "\n"
   "  options for copy actions:\n"
   "\n"
   "    -copy_brick_list   : copy a list of volumes to a new dataset\n"
   "    -cbl               : (a shorter, alternative form)\n"
   "    -copy_im           : (a shorter, alternative form)\n"
   "\n");
   printf(
   "       This action allows the user to copy a list of volumes (over time)\n"
   "       from one dataset to another.  The listed volumes can be in any\n"
   "       order and contain repeats, but are of course restricted to\n"
   "       the set of values {1, 2, ..., nt-1}, from dimension 4.\n"
   "\n");
   printf(
   "       This option is a flag.  The index list is specified with the input\n"
   "       dataset, contained in square brackets.  Note that square brackets\n"
   "       are special to most UNIX shells, so they should be contained\n"
   "       within single quotes.  Syntax of an index list:\n"
   "\n"
   "       notes:\n"
   "\n");
   printf(
   "         - indices start at zero\n"
   "         - indices end at nt-1, which has the special symbol '$'\n"
   "         - single indices should be separated with commas, ','\n"
   "             e.g. -infiles dset0.nii'[0,3,8,5,2,2,2]'\n"
   "         - ranges may be specified using '..' or '-' \n");
   printf(
   "             e.g. -infiles dset0.nii'[2..95]'\n"
   "             e.g. -infiles dset0.nii'[2..$]'\n"
   "         - ranges may have step values, specified in ()\n"
   "           example: 2 through 95 with a step of 3, i.e. {2,5,8,11,...,95}\n"
   "             e.g. -infiles dset0.nii'[2..95(3)]'\n"
   "\n");
   printf(
   "       This functionality applies only to 3 or 4-dimensional datasets.\n"
   "\n"
   "       e.g. to copy a dataset:\n"
   "       nifti_tool -copy_im -prefix new.nii -infiles dset0.nii\n"
   "\n");
   printf(
   "       e.g. to copy sub-bricks 0 and 7:\n"
   "       nifti_tool -cbl -prefix new_07.nii -infiles dset0.nii'[0,7]'\n"
   "\n"
   "       e.g. to copy an entire dataset:\n"
   "       nifti_tool -cbl -prefix new_all.nii -infiles dset0.nii'[0..$]'\n"
   "\n");
   printf(
   "       e.g. to copy every other time point, skipping the first three:\n"
   "       nifti_tool -cbl -prefix new_partial.nii \\\n"
   "                  -infiles dset0.nii'[3..$(2)]'\n"
   "\n"
   "\n"
   "    -copy_collapsed_image ... : copy a list of volumes to a new dataset\n"
   "    -cci I J K T U V W        : (a shorter, alternative form)\n"
   "\n");
   printf(
   "       This action allows the user to copy a collapsed dataset, where\n"
   "       some dimensions are collapsed to a given index.  For instance, the\n"
   "       X dimension could be collapsed to i=42, and the time dimensions\n"
   "       could be collapsed to t=17.  To collapse a dimension, set Di to\n"
   "       the desired index, where i is in {0..ni-1}.  Any dimension that\n"
   "       should not be collapsed must be listed as -1.\n"
   "\n");
   printf(
   "       Any number (of valid) dimensions can be collapsed, even down to a\n"
   "       a single value, by specifying enough valid indices.  The resulting\n"
   "       dataset will then have a reduced number of non-trivial dimensions.\n"
   "\n"
   "       Assume dset0.nii has nim->dim[8] = { 4, 64, 64, 21, 80, 1, 1, 1 }.\n"
   "       Note that this is a 4-dimensional dataset.\n"
   "\n");
   printf(
   "         e.g. copy the time series for voxel i,j,k = 5,4,17\n"
   "         nifti_tool -cci 5 4 17 -1 -1 -1 -1 -prefix new_5_4_17.nii\n"
   "\n"
   "         e.g. read the single volume at time point 26\n"
   "         nifti_tool -cci -1 -1 -1 26 -1 -1 -1 -prefix new_t26.nii\n"
   "\n");
   printf(
   "       Assume dset1.nii has nim->dim[8] = { 6, 64, 64, 21, 80, 4, 3, 1 }.\n"
   "       Note that this is a 6-dimensional dataset.\n"
   "\n"
   "         e.g. copy all time series for voxel i,j,k = 5,0,17, with v=2\n"
   "              (and add the command to the history)\n"
   "         nifti_tool -cci 5 0 17 -1 -1 2 -1  -keep_hist \\\n"
   "                    -prefix new_5_0_17_2.nii\n"
   "\n");
   printf(
   "         e.g. copy all data where i=3, j=19 and v=2\n"
   "              (I do not claim to know a good reason to do this)\n"
   "         nifti_tool -cci 3 19 -1 -1 -1 2 -1 -prefix new_mess.nii\n"
   "\n"
   "       See '-disp_ci' for more information (which displays/prints the\n"
   "       data, instead of copying it to a new dataset).\n"
   "\n"
   "  ------------------------------\n");

   printf(
   "\n"
   "  options for display actions:\n"
   "\n"
   "    -disp_hdr          : display nifti_1_header fields for datasets\n"
   "\n"
   "       This flag means the user wishes to see some of the nifti_1_header\n"
   "       fields in one or more nifti datasets. The user may want to specify\n"
   "       multiple '-field' options along with this.  This option requires\n"
   "       one or more files input, via '-infiles'.\n"
   "\n");
   printf(
   "       If no '-field' option is present, all fields will be displayed.\n"
   "\n"
   "       e.g. to display the contents of all fields:\n"
   "       nifti_tool -disp_hdr -infiles dset0.nii\n"
   "       nifti_tool -disp_hdr -infiles dset0.nii dset1.nii dset2.nii\n"
   "\n"
   "       e.g. to display the contents of select fields:\n"
   "       nifti_tool -disp_hdr -field dim -infiles dset0.nii\n"
   "       nifti_tool -disp_hdr -field dim -field descrip -infiles dset0.nii\n"
   "\n");
   printf(
   "    -disp_nim          : display nifti_image fields for datasets\n"
   "\n"
   "       This flag option works the same way as the '-disp_hdr' option,\n"
   "       except that the fields in question are from the nifti_image\n"
   "       structure.\n"
   "\n");
   printf(
   "    -disp_ana          : display nifti_analyze75 fields for datasets\n"
   "\n"
   "       This flag option works the same way as the '-disp_hdr' option,\n"
   "       except that the fields in question are from the nifti_analyze75\n"
   "       structure.\n"
   "\n");
   printf(
   "    -disp_exts         : display all AFNI-type extensions\n"
   "\n"
   "       This flag option is used to display all nifti_1_extension data,\n"
   "       for only those extensions of type AFNI (code = 4).  The only\n"
   "       other option used will be '-infiles'.\n"
   "\n");
   printf(
   "       e.g. to display the extensions in datasets:\n"
   "       nifti_tool -disp_exts -infiles dset0.nii\n"
   "       nifti_tool -disp_exts -infiles dset0.nii dset1.nii dset2.nii\n"
   "\n");
   printf(
   "    -disp_ts I J K    : display ASCII time series at i,j,k = I,J,K\n"
   "\n"
   "       This option is used to display the time series data for the voxel\n"
   "       at i,j,k indices I,J,K.  The data is displayed in text, either all\n"
   "       on one line (the default), or as one number per line (via the\n"
   "       '-dci_lines' option).\n"
   "\n");
   printf(
   "       Notes:\n"
   "\n"
   "         o This function applies only to 4-dimensional datasets.\n"
   "         o The '-quiet' option can be used to suppress the text header,\n"
   "           leaving only the data.\n"
   "         o This option is short for using '-disp_ci' (display collapsed\n"
   "           image), restricted to 4-dimensional datasets.  i.e. :\n"
   "               -disp_ci I J K -1 -1 -1 -1\n"
   "\n");
   printf(
   "       e.g. to display the time series at voxel 23, 0, 172:\n"
   "       nifti_tool -disp_ts 23 0 172            -infiles dset1_time.nii\n"
   "       nifti_tool -disp_ts 23 0 172 -dci_lines -infiles dset1_time.nii\n"
   "       nifti_tool -disp_ts 23 0 172 -quiet     -infiles dset1_time.nii\n"
   "\n");
   printf(
   "    -disp_collapsed_image  : display ASCII values for collapsed dataset\n"
   "    -disp_ci I J K T U V W : (a shorter, alternative form)\n"
   "\n"
   "       This option is used to display all of the data from a collapsed\n"
   "       image, given the dimension list.  The data is displayed in text,\n"
   "       either all on one line (the default), or as one number per line\n"
   "       (by using the '-dci_lines' flag).\n"
   "\n");
   printf(
   "       The '-quiet' option can be used to suppress the text header.\n"
   "\n"
   "       e.g. to display the time series at voxel 23, 0, 172:\n"
   "       nifti_tool -disp_ci 23 0 172 -1 0 0 0 -infiles dset1_time.nii\n"
   "\n"
   "       e.g. to display z-slice 14, at time t=68:\n"
   "       nifti_tool -disp_ci -1 -1 14 68 0 0 0 -infiles dset1_time.nii\n"
   "\n"
   "       See '-ccd' for more information, which copies such data to a new\n"
   "       dataset, instead of printing it to the terminal window.\n"
   "\n"
   "  ------------------------------\n");
   printf(
   "\n"
   "  options for modification actions:\n"
   "\n"
   "    -mod_hdr           : modify nifti_1_header fields for datasets\n"
   "\n"
   "       This action is used to modify some of the nifti_1_header fields in\n"
   "       one or more datasets.  The user must specify a list of fields to\n"
   "       modify via one or more '-mod_field' options, which include field\n"
   "       names, along with the new (set of) values.\n"
   "\n");
   printf(
   "       The user can modify a dataset in place, or use '-prefix' to\n"
   "       produce a new dataset, to which the changes have been applied.\n"
   "       It is recommended to normally use the '-prefix' option, so as not\n"
   "       to ruin a dataset.\n"
   "\n");
   printf(
   "       Note that some fields have a length greater than 1, meaning that\n"
   "       the field is an array of numbers, or a string of characters.  In\n"
   "       order to modify an array of numbers, the user must provide the\n"
   "       correct number of values, and contain those values in quotes, so\n"
   "       that they are seen as a single option.\n"
   "\n");
   printf(
   "       To modify a string field, put the string in quotes.\n"
   "\n"
   "       The '-mod_field' option takes a field_name and a list of values.\n"
   "\n"
   "       e.g. to modify the contents of various fields:\n"
   "\n");
   printf(
   "       nifti_tool -mod_hdr -prefix dnew -infiles dset0.nii  \\\n"
   "                  -mod_field qoffset_x -17.325\n"
   "       nifti_tool -mod_hdr -prefix dnew -infiles dset0.nii  \\\n"
   "                  -mod_field dim '4 64 64 20 30 1 1 1 1'\n"
   "       nifti_tool -mod_hdr -prefix dnew -infiles dset0.nii  \\\n"
   "                  -mod_field descrip 'beer, brats and cheese, mmmmm...'\n"
   "\n");
   printf(
   "       e.g. to modify the contents of multiple fields:\n"
   "       nifti_tool -mod_hdr -prefix dnew -infiles dset0.nii  \\\n"
   "                  -mod_field qoffset_x -17.325 -mod_field slice_start 1\n"
   "\n"
   "       e.g. to modify the contents of multiple files (must overwrite):\n"
   "       nifti_tool -mod_hdr -overwrite -mod_field qoffset_x -17.325   \\\n"
   "                  -infiles dset0.nii dset1.nii\n"
   "\n");
   printf(
   "    -mod_nim          : modify nifti_image fields for datasets\n"
   "\n"
   "       This action option is used the same way that '-mod_hdr' is used,\n"
   "       except that the fields in question are from the nifti_image\n"
   "       structure.\n"
   "\n");
   printf(
   "    -strip_extras     : remove extensions and descriptions from datasets\n"
   "\n"
   "       This action is used to attempt to 'clean' a dataset of general\n"
   "       text, in order to make it more anonymous.  Extensions and the\n"
   "       nifti_image descrip field are cleared by this action.\n"
   "\n");
   printf(
   "       e.g. to strip all *.nii datasets in this directory:\n"
   "       nifti_tool -strip -overwrite -infiles *.nii\n"
   "\n");
   printf(
   "    -swap_as_nifti    : swap the header according to nifti_1_header\n"
   "\n"
   "       Perhaps a NIfTI header is mal-formed, and the user explicitly\n"
   "       wants to swap it before performing other operations.  This action\n"
   "       will swap the field bytes under the assumption that the header is\n"
   "       in the NIfTI format.\n"
   "\n");
   printf(
   "       ** The recommended course of action is to make a copy of the\n"
   "          dataset and overwrite the header via -overwrite.  If the header\n"
   "          needs such an operation, it is likely that the data would not\n"
   "          otherwise be read in correctly.\n"
   "\n");
   printf(
   "    -swap_as_analyze  : swap the header according to nifti_analyze75\n"
   "\n"
   "       Perhaps an ANALYZE header is mal-formed, and the user explicitly\n"
   "       wants to swap it before performing other operations.  This action\n"
   "       will swap the field bytes under the assumption that the header is\n"
   "       in the ANALYZE 7.5 format.\n"
   "\n");
   printf(
   "       ** The recommended course of action is to make a copy of the\n"
   "          dataset and overwrite the header via -overwrite.  If the header\n"
   "          needs such an operation, it is likely that the data would not\n"
   "          otherwise be read in correctly.\n"
   "\n");
   printf(
   "    -swap_as_old      : swap the header using the old method\n"
   "\n"
   "       As of library version 1.35 (3 Aug, 2008), nifticlib now swaps all\n"
   "       fields of a NIfTI dataset (including UNUSED ones), and it swaps\n"
   "       ANALYZE datasets according to the nifti_analyze75 structure.\n"
   "       This is a significant different in the case of ANALYZE datasets.\n"
   "\n");
   printf(
   "       The -swap_as_old option was added to compare the results of the\n"
   "       swapping methods, or to undo one swapping method and replace it\n"
   "       with another (such as to undo the old method and apply the new).\n"
   "\n");
   printf("  ------------------------------\n");
   printf(
   "\n"
   "  options for adding/removing extensions:\n"
   "\n"
   "    -add_afni_ext EXT : add an AFNI extension to the dataset\n"
   "\n"
   "       This option is used to add AFNI-type extensions to one or more\n"
   "       datasets.  This option may be used more than once to add more than\n"
   "       one extension.\n"
   "\n"
   "       If EXT is of the form 'file:FILENAME', then the extension will\n"
   "       be read from the file, FILENAME.\n"
   "\n");
   printf(
   "       The '-prefix' option is recommended, to create a new dataset.\n"
   "       In such a case, only a single file may be taken as input.  Using\n"
   "       '-overwrite' allows the user to overwrite the current file, or\n"
   "       to add the extension(s) to multiple files, overwriting them.\n"
   "\n");
   printf(
   "       e.g. to add a generic AFNI extension:\n"
   "       nifti_tool -add_afni_ext 'wow, my first extension' -prefix dnew \\\n"
   "                  -infiles dset0.nii\n"
   "\n"
   "       e.g. to add multiple AFNI extensions:\n"
   "       nifti_tool -add_afni_ext 'wow, my first extension :)'      \\\n"
   "                  -add_afni_ext 'look, my second...'              \\\n"
   "                  -prefix dnew -infiles dset0.nii\n"
   "\n");
   printf(
   "       e.g. to add an extension, and overwrite the dataset:\n"
   "       nifti_tool -add_afni_ext 'some AFNI extension' -overwrite \\\n"
   "                  -infiles dset0.nii dset1.nii \n"
   "\n");
   printf(
   "    -add_comment_ext EXT : add a COMMENT extension to the dataset\n"
   "\n"
   "       This option is used to add COMMENT-type extensions to one or more\n"
   "       datasets.  This option may be used more than once to add more than\n"
   "       one extension.  This option may also be used with '-add_afni_ext'.\n"
   "\n"
   "       If EXT is of the form 'file:FILENAME', then the extension will\n"
   "       be read from the file, FILENAME.\n"
   "\n");
   printf(
   "       The '-prefix' option is recommended, to create a new dataset.\n"
   "       In such a case, only a single file may be taken as input.  Using\n"
   "       '-overwrite' allows the user to overwrite the current file, or\n"
   "       to add the extension(s) to multiple files, overwriting them.\n"
   "\n");
   printf(
   "       e.g. to add a comment about the dataset:\n"
   "       nifti_tool -add_comment 'converted from MY_AFNI_DSET+orig' \\\n"
   "                  -prefix dnew                                    \\\n"
   "                  -infiles dset0.nii\n"
   "\n");
   printf(
   "       e.g. to add multiple extensions:\n"
   "       nifti_tool -add_comment  'add a comment extension'         \\\n"
   "                  -add_afni_ext 'and an AFNI XML style extension' \\\n"
   "                  -add_comment  'dataset copied from dset0.nii'   \\\n"
   "                  -prefix dnew -infiles dset0.nii\n"
   "\n");
   printf(
   "    -rm_ext INDEX     : remove the extension given by INDEX\n"
   "\n"
   "       This option is used to remove any single extension from the\n"
   "       dataset.  Multiple extensions require multiple options.\n"
   "\n"
   "       notes  - extension indices begin with 0 (zero)\n"
   "              - to view the current extensions, see '-disp_exts'\n"
   "              - all extensions can be removed using ALL or -1 for INDEX\n"
   "\n");
   printf(
   "       e.g. to remove the extension #0:\n"
   "       nifti_tool -rm_ext 0 -overwrite -infiles dset0.nii\n"
   "\n"
   "       e.g. to remove ALL extensions:\n"
   "       nifti_tool -rm_ext ALL -prefix dset1 -infiles dset0.nii\n"
   "       nifti_tool -rm_ext -1  -prefix dset1 -infiles dset0.nii\n"
   "\n");
   printf(
   "       e.g. to remove the extensions #2, #3 and #5:\n"
   "       nifti_tool -rm_ext 2 -rm_ext 3 -rm_ext 5 -overwrite \\\n"
   "                  -infiles dset0.nii\n"
   "\n"
   "  ------------------------------\n");

   printf(
   "\n"
   "  options for showing differences:\n"
   "\n"
   "    -diff_hdr         : display header field diffs between two datasets\n"
   "\n"
   "       This option is used to find differences between two datasets.\n"
   "       If any fields are different, the contents of those fields is\n"
   "       displayed (unless the '-quiet' option is used).\n"
   "\n");
   printf(
   "       A list of fields can be specified by using multiple '-field'\n"
   "       options.  If no '-field' option is given, all fields will be\n"
   "       checked.\n"
   "\n"
   "       Exactly two dataset names must be provided via '-infiles'.\n"
   "\n"
   "       e.g. to display all nifti_1_header field differences:\n"
   "       nifti_tool -diff_hdr -infiles dset0.nii dset1.nii\n"
   "\n");
   printf(
   "       e.g. to display selected nifti_1_header field differences:\n"
   "       nifti_tool -diff_hdr -field dim -field intent_code  \\\n"
   "                  -infiles dset0.nii dset1.nii \n"
   "\n"
   "    -diff_nim         : display nifti_image field diffs between datasets\n"
   "\n"
   "       This option works the same as '-diff_hdr', except that the fields\n"
   "       in question are from the nifti_image structure.\n"
   "\n"
   "  ------------------------------\n");

   printf(
   "\n"
   "  miscellaneous options:\n"
   "\n"
   "    -debug LEVEL      : set the debugging level\n"
   "\n"
   "       Level 0 will attempt to operate with no screen output, but errors.\n"
   "       Level 1 is the default.\n"
   "       Levels 2 and 3 give progressively more information.\n"
   "\n"
   "       e.g. -debug 2\n"
   "\n");
   printf(
   "    -field FIELDNAME  : provide a field to work with\n"
   "\n"
   "       This option is used to provide a field to display, modify or\n"
   "       compare.  This option can be used along with one of the action\n"
   "       options presented above.\n"
   "\n"
   "       See '-disp_hdr', above, for complete examples.\n"
   "\n"
   "       e.g. nifti_tool -field descrip\n"
   "       e.g. nifti_tool -field descrip -field dim\n"
   "\n");
   printf(
   "    -infiles file0... : provide a list of files to work with\n"
   "\n"
   "       This parameter is required for any of the actions, in order to\n"
   "       provide a list of files to process.  If input filenames do not\n"
   "       have an extension, the directory we be searched for any\n"
   "       appropriate files (such as .nii or .hdr).\n"
   "\n");
   printf(
   "       Note: if the filename has the form MAKE_IM, then a new dataset\n"
   "       will be created, without the need for file input.\n"
   "\n");
   printf(
   "       See '-mod_hdr', above, for complete examples.\n"
   "\n"
   "       e.g. nifti_tool -infiles file0.nii\n"
   "       e.g. nifti_tool -infiles file1.nii file2 file3.hdr\n"
   "\n");
   printf(
   "    -mod_field NAME 'VALUE_LIST' : provide new values for a field\n"
   "\n"
   "       This parameter is required for any the modification actions.\n"
   "       If the user wants to modify any fields of a dataset, this is\n"
   "       where the fields and values are specified.\n"
   "\n");
   printf(
   "       NAME is a field name (in either the nifti_1_header structure or\n"
   "       the nifti_image structure).  If the action option is '-mod_hdr',\n"
   "       then NAME must be the name of a nifti_1_header field.  If the\n"
   "       action is '-mod_nim', NAME must be from a nifti_image structure.\n"
   "\n");
   printf(
   "       VALUE_LIST must be one or more values, as many as are required\n"
   "       for the field, contained in quotes if more than one is provided.\n"
   "\n"
   "       Use 'nifti_tool -help_hdr' to get a list of nifti_1_header fields\n"
   "       Use 'nifti_tool -help_nim' to get a list of nifti_image fields\n"
   "\n"
   "       See '-mod_hdr', above, for complete examples.\n"
   "\n");
   printf(
   "       e.g. modifying nifti_1_header fields:\n"
   "            -mod_field descrip 'toga, toga, toga'\n"
   "            -mod_field qoffset_x 19.4 -mod_field qoffset_z -11\n"
   "            -mod_field pixdim '1 0.9375 0.9375 1.2 1 1 1 1'\n"
   "\n");
   printf(
   "    -keep_hist         : add the command as COMMENT (to the 'history')\n"
   "\n"
   "        When this option is used, the current command will be added\n"
   "        as a NIFTI_ECODE_COMMENT type extension.  This provides the\n"
   "        ability to keep a history of commands affecting a dataset.\n"
   "\n"
   "       e.g. -keep_hist\n"
   "\n");
   printf(
   "    -overwrite        : any modifications will be made to input files\n"
   "\n"
   "       This option is used so that all field modifications, including\n"
   "       extension additions or deletions, will be made to the files that\n"
   "       are input.\n"
   "\n");
   printf(
   "       In general, the user is recommended to use the '-prefix' option\n"
   "       to create new files.  But if overwriting the contents of the\n"
   "       input files is preferred, this is how to do it.\n"
   "\n"
   "       See '-mod_hdr' or '-add_afni_ext', above, for complete examples.\n"
   "\n"
   "       e.g. -overwrite\n"
   "\n");
   printf(
   "    -prefix           : specify an output file to write change into\n"
   "\n"
   "       This option is used to specify an output file to write, after\n"
   "       modifications have been made.  If modifications are being made,\n"
   "       then either '-prefix' or '-overwrite' is required.\n"
   "\n"
   "       If no extension is given, the output extension will be '.nii'.\n"
   "\n");
   printf(
   "       e.g. -prefix new_dset\n"
   "       e.g. -prefix new_dset.nii\n"
   "       e.g. -prefix new_dset.hdr\n"
   "\n"
   "    -quiet            : report only errors or requested information\n"
   "\n"
   "       This option is equivalent to '-debug 0'.\n"
   "\n"
   "  ------------------------------\n");

   printf(
   "\n"
   "  basic help options:\n"
   "\n"
   "    -help             : show this help\n"
   "\n"
   "       e.g.  nifti_tool -help\n"
   "\n"
   "    -help_hdr         : show nifti_1_header field info\n"
   "\n"
   "       e.g.  nifti_tool -help_hdr\n"
   "\n"
   "    -help_nim         : show nifti_image field info\n"
   "\n"
   "       e.g.  nifti_tool -help_nim\n"
   "\n"
   "    -help_ana         : show nifti_analyze75 field info\n"
   "\n"
   "       e.g.  nifti_tool -help_ana\n"
   );

   printf(
   "\n"
   "    -help_datatypes [TYPE] : display datatype table\n"
   "\n"
   "       e.g.  nifti_tool -help_datatypes\n"
   "       e.g.  nifti_tool -help_datatypes N\n"
   "\n"
   "       This displays the contents of the nifti_type_list table.\n"
   "       An additional 'D' or 'N' parameter will restrict the type\n"
   "       name to 'DT_' or 'NIFTI_TYPE_' names, 'T' will test.\n");

   printf(
   "\n"
   "    -ver              : show the program version number\n"
   "\n"
   "       e.g.  nifti_tool -ver\n"
   "\n"
   "    -hist             : show the program modification history\n"
   "\n"
   "       e.g.  nifti_tool -hist\n"
   "\n");
   printf(
   "    -nifti_ver        : show the nifti library version number\n"
   "\n"
   "       e.g.  nifti_tool -nifti_ver\n"
   "\n"
   "    -nifti_hist       : show the nifti library modification history\n"
   "\n"
   "       e.g.  nifti_tool -nifti_hist\n"
   "\n"
   "    -with_zlib        : print whether library was compiled with zlib\n"
   "\n"
   "       e.g.  nifti_tool -with_zlib\n"
   "\n"
   "  ------------------------------\n"
   "\n"
   "  R. Reynolds\n"
   "  compiled: %s\n"
   "  %s\n\n",
   __DATE__, g_version );

   return 1;
}